

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

CBString *
insydeFlashDeviceMapEntryTypeGuidToUString(CBString *__return_storage_ptr__,EFI_GUID *guid)

{
  bool bVar1;
  undefined1 local_38 [8];
  UByteArray baGuid;
  EFI_GUID *guid_local;
  
  baGuid.d.field_2._8_8_ = guid;
  UByteArray::UByteArray((UByteArray *)local_38,(char *)guid,0x10);
  bVar1 = UByteArray::operator==((UByteArray *)local_38,&INSYDE_FLASH_MAP_REGION_BOOT_FV_GUID);
  if (bVar1) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Boot Firmare Volume");
  }
  else {
    bVar1 = UByteArray::operator==((UByteArray *)local_38,&INSYDE_FLASH_MAP_REGION_BVDT_GUID);
    if (bVar1) {
      Bstrlib::CBString::CBString(__return_storage_ptr__,"BIOS Version Data Table");
    }
    else {
      bVar1 = UByteArray::operator==((UByteArray *)local_38,&INSYDE_FLASH_MAP_REGION_EC_GUID);
      if (bVar1) {
        Bstrlib::CBString::CBString(__return_storage_ptr__,"EC Firmware");
      }
      else {
        bVar1 = UByteArray::operator==
                          ((UByteArray *)local_38,&INSYDE_FLASH_MAP_REGION_FTW_BACKUP_GUID);
        if (bVar1) {
          Bstrlib::CBString::CBString(__return_storage_ptr__,"FTW Backup");
        }
        else {
          bVar1 = UByteArray::operator==
                            ((UByteArray *)local_38,&INSYDE_FLASH_MAP_REGION_FTW_STATE_GUID);
          if (bVar1) {
            Bstrlib::CBString::CBString(__return_storage_ptr__,"FTW State");
          }
          else {
            bVar1 = UByteArray::operator==((UByteArray *)local_38,&INSYDE_FLASH_MAP_REGION_FV_GUID);
            if (bVar1) {
              Bstrlib::CBString::CBString(__return_storage_ptr__,"Firmare Volume");
            }
            else {
              bVar1 = UByteArray::operator==
                                ((UByteArray *)local_38,
                                 &INSYDE_FLASH_MAP_REGION_FLASH_DEVICE_MAP_GUID);
              if (bVar1) {
                Bstrlib::CBString::CBString(__return_storage_ptr__,"Flash Device Map");
              }
              else {
                bVar1 = UByteArray::operator==
                                  ((UByteArray *)local_38,&INSYDE_FLASH_MAP_REGION_LOGO_GUID);
                if (bVar1) {
                  Bstrlib::CBString::CBString(__return_storage_ptr__,"Logo");
                }
                else {
                  bVar1 = UByteArray::operator==
                                    ((UByteArray *)local_38,&INSYDE_FLASH_MAP_REGION_MICROCODE_GUID)
                  ;
                  if (bVar1) {
                    Bstrlib::CBString::CBString(__return_storage_ptr__,"Microcode");
                  }
                  else {
                    bVar1 = UByteArray::operator==
                                      ((UByteArray *)local_38,
                                       &INSYDE_FLASH_MAP_REGION_MSDM_TABLE_GUID);
                    if (bVar1) {
                      Bstrlib::CBString::CBString(__return_storage_ptr__,"MSDM Table");
                    }
                    else {
                      bVar1 = UByteArray::operator==
                                        ((UByteArray *)local_38,
                                         &INSYDE_FLASH_MAP_REGION_MULTI_CONFIG_GUID);
                      if (bVar1) {
                        Bstrlib::CBString::CBString(__return_storage_ptr__,"MultiConfig");
                      }
                      else {
                        bVar1 = UByteArray::operator==
                                          ((UByteArray *)local_38,
                                           &INSYDE_FLASH_MAP_REGION_VAR_DEFAULT_GUID);
                        if (bVar1) {
                          Bstrlib::CBString::CBString(__return_storage_ptr__,"Variable Defaults");
                        }
                        else {
                          bVar1 = UByteArray::operator==
                                            ((UByteArray *)local_38,
                                             &INSYDE_FLASH_MAP_REGION_SMBIOS_UPDATE_GUID);
                          if (bVar1) {
                            Bstrlib::CBString::CBString(__return_storage_ptr__,"SMBIOS Update");
                          }
                          else {
                            bVar1 = UByteArray::operator==
                                              ((UByteArray *)local_38,
                                               &INSYDE_FLASH_MAP_REGION_VAR_GUID);
                            if (bVar1) {
                              Bstrlib::CBString::CBString(__return_storage_ptr__,"Variables");
                            }
                            else {
                              bVar1 = UByteArray::operator==
                                                ((UByteArray *)local_38,
                                                 &INSYDE_FLASH_MAP_REGION_UNKNOWN_GUID);
                              if (bVar1) {
                                Bstrlib::CBString::CBString(__return_storage_ptr__,"Unknown");
                              }
                              else {
                                bVar1 = UByteArray::operator==
                                                  ((UByteArray *)local_38,
                                                   &INSYDE_FLASH_MAP_REGION_UNUSED_GUID);
                                if (bVar1) {
                                  Bstrlib::CBString::CBString(__return_storage_ptr__,"Unused");
                                }
                                else {
                                  bVar1 = UByteArray::operator==
                                                    ((UByteArray *)local_38,
                                                     &INSYDE_FLASH_MAP_REGION_USB_OPTION_ROM_GUID);
                                  if (bVar1) {
                                    Bstrlib::CBString::CBString
                                              (__return_storage_ptr__,"USB Option ROM");
                                  }
                                  else {
                                    bVar1 = UByteArray::operator==
                                                      ((UByteArray *)local_38,
                                                       &INSYDE_FLASH_MAP_REGION_DXE_FV_GUID);
                                    if (bVar1) {
                                      Bstrlib::CBString::CBString
                                                (__return_storage_ptr__,"DXE Firmare Volume");
                                    }
                                    else {
                                      bVar1 = UByteArray::operator==
                                                        ((UByteArray *)local_38,
                                                         &INSYDE_FLASH_MAP_REGION_PEI_FV_GUID);
                                      if (bVar1) {
                                        Bstrlib::CBString::CBString
                                                  (__return_storage_ptr__,"PEI Firmare Volume");
                                      }
                                      else {
                                        bVar1 = UByteArray::operator==
                                                          ((UByteArray *)local_38,
                                                           &INSYDE_FLASH_MAP_REGION_UNSIGNED_FV_GUID
                                                          );
                                        if (bVar1) {
                                          Bstrlib::CBString::CBString
                                                    (__return_storage_ptr__,
                                                     "Unsigned Firmare Volume");
                                        }
                                        else {
                                          guidToUString(__return_storage_ptr__,
                                                        (EFI_GUID *)baGuid.d.field_2._8_8_,true);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  UByteArray::~UByteArray((UByteArray *)local_38);
  return __return_storage_ptr__;
}

Assistant:

UString insydeFlashDeviceMapEntryTypeGuidToUString(const EFI_GUID & guid)
{
    const UByteArray baGuid((const char*)&guid, sizeof(EFI_GUID));
    if (baGuid == INSYDE_FLASH_MAP_REGION_BOOT_FV_GUID)          return UString("Boot Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_BVDT_GUID)             return UString("BIOS Version Data Table");
    if (baGuid == INSYDE_FLASH_MAP_REGION_EC_GUID)               return UString("EC Firmware");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FTW_BACKUP_GUID)       return UString("FTW Backup");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FTW_STATE_GUID)        return UString("FTW State");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FV_GUID)               return UString("Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_FLASH_DEVICE_MAP_GUID) return UString("Flash Device Map");
    if (baGuid == INSYDE_FLASH_MAP_REGION_LOGO_GUID)             return UString("Logo");
    if (baGuid == INSYDE_FLASH_MAP_REGION_MICROCODE_GUID)        return UString("Microcode");
    if (baGuid == INSYDE_FLASH_MAP_REGION_MSDM_TABLE_GUID)       return UString("MSDM Table");
    if (baGuid == INSYDE_FLASH_MAP_REGION_MULTI_CONFIG_GUID)     return UString("MultiConfig");
    if (baGuid == INSYDE_FLASH_MAP_REGION_VAR_DEFAULT_GUID)      return UString("Variable Defaults");
    if (baGuid == INSYDE_FLASH_MAP_REGION_SMBIOS_UPDATE_GUID)    return UString("SMBIOS Update");
    if (baGuid == INSYDE_FLASH_MAP_REGION_VAR_GUID)              return UString("Variables");
    if (baGuid == INSYDE_FLASH_MAP_REGION_UNKNOWN_GUID)          return UString("Unknown");
    if (baGuid == INSYDE_FLASH_MAP_REGION_UNUSED_GUID)           return UString("Unused");
    if (baGuid == INSYDE_FLASH_MAP_REGION_USB_OPTION_ROM_GUID)   return UString("USB Option ROM");
    if (baGuid == INSYDE_FLASH_MAP_REGION_DXE_FV_GUID)           return UString("DXE Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_PEI_FV_GUID)           return UString("PEI Firmare Volume");
    if (baGuid == INSYDE_FLASH_MAP_REGION_UNSIGNED_FV_GUID)      return UString("Unsigned Firmare Volume");
    return guidToUString(guid);
}